

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

int __thiscall
TasGrid::GridLocalPolynomial::removePointsByHierarchicalCoefficient
          (GridLocalPolynomial *this,double tolerance,int output,double *scale_correction)

{
  double dVar1;
  int iVar2;
  size_type __n;
  reference pvVar3;
  reference rVar4;
  double *local_e8;
  int local_cc;
  reference local_c0;
  int local_b0;
  allocator<bool> local_a9;
  int i;
  vector<bool,_std::allocator<bool>_> pmap;
  allocator<double> local_69;
  value_type_conflict2 local_68;
  vector<double,_std::allocator<double>_> local_60;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> rescaled;
  int active_outputs;
  int num_points;
  double *scale_correction_local;
  int output_local;
  double tolerance_local;
  GridLocalPolynomial *this_local;
  
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  rescaled.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  if (output == -1) {
    local_cc = (this->super_BaseCanonicalGrid).num_outputs;
  }
  else {
    local_cc = 1;
  }
  rescaled.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = local_cc;
  pmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ._3_1_ = 0;
  local_e8 = scale_correction;
  if (scale_correction == (double *)0x0) {
    local_cc = rescaled.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ * local_cc;
    local_68 = 1.0;
    ::std::allocator<double>::allocator(&local_69);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_60,(long)local_cc,&local_68,&local_69);
    pmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._3_1_ = 1;
    local_e8 = ::std::vector<double,_std::allocator<double>_>::data(&local_60);
  }
  getScaledCoefficients((vector<double,_std::allocator<double>_> *)local_48,this,output,local_e8);
  if ((pmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage._3_1_ & 1) != 0) {
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_60);
  }
  if (scale_correction == (double *)0x0) {
    ::std::allocator<double>::~allocator(&local_69);
  }
  __n = (size_type)
        rescaled.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_;
  ::std::allocator<bool>::allocator(&local_a9);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i,__n,&local_a9);
  ::std::allocator<bool>::~allocator(&local_a9);
  for (local_b0 = 0;
      local_b0 <
      rescaled.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_; local_b0 = local_b0 + 1) {
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_48,(long)local_b0);
    dVar1 = *pvVar3;
    rVar4 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&i,(long)local_b0);
    local_c0 = rVar4;
    ::std::_Bit_reference::operator=(&local_c0,tolerance < dVar1);
  }
  iVar2 = removeMappedPoints(this,(vector<bool,_std::allocator<bool>_> *)&i);
  ::std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return iVar2;
}

Assistant:

int GridLocalPolynomial::removePointsByHierarchicalCoefficient(double tolerance, int output, const double *scale_correction){
    clearRefinement();
    int num_points = points.getNumIndexes();

    int active_outputs = (output == -1) ? num_outputs : 1;
    std::vector<double> rescaled = getScaledCoefficients(output, (scale_correction == nullptr) ?
                                        std::vector<double>(num_points * active_outputs, 1.0).data() : scale_correction);

    std::vector<bool> pmap(num_points); // point map, set to true if the point is to be kept, false otherwise
    for(int i=0; i<num_points; i++) pmap[i] = (rescaled[i] > tolerance);

    return removeMappedPoints(pmap);
}